

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FboCases::MixTest::render(MixTest *this,Context *context,Surface *dst)

{
  FboConfig *config;
  uint uVar1;
  deUint32 program;
  uint uVar2;
  int in_R9D;
  Vec3 local_35c;
  Framebuffer fboB;
  Framebuffer fboA;
  undefined1 *local_2ec;
  float local_2e4;
  MixTexturesShader mixShader;
  SingleTex2DShader singleTexShader;
  
  SingleTex2DShader::SingleTex2DShader(&singleTexShader);
  MixTexturesShader::MixTexturesShader(&mixShader);
  uVar1 = (*context->_vptr_Context[0x75])(context,&singleTexShader);
  program = (*context->_vptr_Context[0x75])(context,&mixShader);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  createMetaballsTex2D(context,1,0x1907,0x40,0x40,in_R9D);
  (*context->_vptr_Context[0x76])(context,(ulong)uVar1);
  uVar2 = (*context->_vptr_Context[0x66])(context,(ulong)uVar1,"u_sampler0");
  (*context->_vptr_Context[0x5b])(context,(ulong)uVar2,0);
  MixTexturesShader::setUnits(&mixShader,context,program,0,1);
  config = &(this->super_FboRenderCase).m_config;
  Functional::Framebuffer::Framebuffer
            (&fboA,context,config,this->m_fboAWidth,this->m_fboAHeight,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fboA);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboA.m_framebuffer);
  (*context->_vptr_Context[5])
            (context,0,0,(ulong)(uint)this->m_fboAWidth,(ulong)(uint)this->m_fboAHeight);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[6])(context,0xde1,1);
  fboB.m_config.colorbufferType = 0xbf800000;
  fboB.m_config.colorbufferFormat = 0xbf800000;
  fboB.m_config.depthbufferType = 0;
  local_35c.m_data._0_8_ = &DAT_3f8000003f800000;
  local_35c.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar1,(Vec3 *)&fboB,&local_35c);
  Functional::Framebuffer::Framebuffer
            (&fboB,context,config,this->m_fboBWidth,this->m_fboBHeight,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fboB);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  (*context->_vptr_Context[5])
            (context,0,0,(ulong)(uint)this->m_fboBWidth,(ulong)(uint)this->m_fboBHeight);
  (*context->_vptr_Context[0x33])(context,0xc11);
  (*context->_vptr_Context[0x32])(context,0,0,0x20,0x40);
  (*context->_vptr_Context[0x2a])(0x3f800000,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x32])(context,0x20,0,0x20,0x40);
  (*context->_vptr_Context[0x2a])(0,0x3f800000,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x34])(context,0xc11);
  (*context->_vptr_Context[4])(context,0x84c0);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_colorbuffer);
  (*context->_vptr_Context[4])(context,0x84c1);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fboB.m_colorbuffer);
  (*context->_vptr_Context[9])(context,0x8d40,0);
  uVar1 = (*context->_vptr_Context[2])(context);
  uVar2 = (*context->_vptr_Context[3])(context);
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar1,(ulong)uVar2);
  local_35c.m_data[0] = -1.0;
  local_35c.m_data[1] = -1.0;
  local_35c.m_data[2] = 0.0;
  local_2ec = &DAT_3f8000003f800000;
  local_2e4 = 0.0;
  sglr::drawQuad(context,program,&local_35c,(Vec3 *)&local_2ec);
  uVar1 = (*context->_vptr_Context[2])(context);
  uVar2 = (*context->_vptr_Context[3])(context);
  (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar1,(ulong)uVar2);
  Functional::Framebuffer::~Framebuffer(&fboB);
  Functional::Framebuffer::~Framebuffer(&fboA);
  sglr::ShaderProgram::~ShaderProgram(&mixShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&singleTexShader.super_ShaderProgram);
  return;
}

Assistant:

void MixTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	singleTexShader;
	MixTexturesShader	mixShader;

	deUint32			singleTexShaderID	= context.createProgram(&singleTexShader);
	deUint32			mixShaderID			= context.createProgram(&mixShader);

	// Texture with metaballs
	deUint32 metaballsTex = 1;
	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	// Setup shaders
	singleTexShader.setUnit(context, singleTexShaderID, 0);
	mixShader.setUnits(context, mixShaderID, 0, 1);

	// Fbo, quad with metaballs texture
	Framebuffer fboA(context, getConfig(), m_fboAWidth, m_fboAHeight);
	fboA.checkCompleteness();
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.viewport(0, 0, m_fboAWidth, m_fboAHeight);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, singleTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Fbo, color clears
	Framebuffer fboB(context, getConfig(), m_fboBWidth, m_fboBHeight);
	fboB.checkCompleteness();
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.viewport(0, 0, m_fboBWidth, m_fboBHeight);
	context.enable(GL_SCISSOR_TEST);
	context.scissor(0, 0, 32, 64);
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.scissor(32, 0, 32, 64);
	context.clearColor(0.0f, 1.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.disable(GL_SCISSOR_TEST);

	// Final mix op
	context.activeTexture(GL_TEXTURE0);
	context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
	context.activeTexture(GL_TEXTURE1);
	context.bindTexture(GL_TEXTURE_2D, fboB.getColorbuffer());
	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
	context.viewport(0, 0, context.getWidth(), context.getHeight());
	sglr::drawQuad(context, mixShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
}